

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

Cluster * __thiscall
cnn::HierarchicalSoftmaxBuilder::ReadClusterFile
          (HierarchicalSoftmaxBuilder *this,string *cluster_file,Dict *word_dict)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  uint uVar4;
  ostream *poVar5;
  Cluster *pCVar6;
  Dict *this_00;
  char *pcVar7;
  reference puVar8;
  size_type sVar9;
  reference ppCVar10;
  string *in_RSI;
  long in_RDI;
  uint widx;
  string word;
  uint endw;
  uint startw;
  uint symbol_1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Cluster *node;
  string symbol;
  uint endp;
  uint startp;
  uint len;
  Cluster *root;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  string line;
  int wc;
  ifstream in;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc80;
  Cluster *in_stack_fffffffffffffc88;
  uint word_00;
  uint in_stack_fffffffffffffc90;
  undefined2 in_stack_fffffffffffffc94;
  undefined1 in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  undefined6 in_stack_fffffffffffffca0;
  undefined1 uVar11;
  Cluster *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  string local_2f8 [36];
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint *local_2c8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2c0;
  undefined1 *local_2b8;
  Cluster *local_2b0;
  int local_2a8;
  int local_2a4;
  string local_2a0 [32];
  uint local_280;
  uint local_27c;
  uint local_278;
  Cluster *local_268;
  undefined1 local_260 [24];
  string local_248 [36];
  int local_224;
  istream local_220 [528];
  string *local_10;
  
  local_10 = in_RSI;
  poVar5 = std::operator<<((ostream *)&std::cerr,"Reading clusters from ");
  poVar5 = std::operator<<(poVar5,local_10);
  std::operator<<(poVar5," ...\n");
  std::ifstream::ifstream(local_220,local_10,8);
  local_224 = 0;
  std::__cxx11::string::string(local_248);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x5ea42d);
  pCVar6 = (Cluster *)operator_new(0xb8);
  Cluster::Cluster(in_stack_fffffffffffffcb0);
  local_268 = pCVar6;
  do {
    this_00 = (Dict *)std::getline<char,std::char_traits<char>,std::allocator<char>>
                                (local_220,local_248);
    uVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&this_00->frozen + *(long *)(*(long *)this_00 + -0x18)));
    if (!(bool)uVar1) {
      std::operator<<((ostream *)&std::cerr,"Done reading clusters.\n");
      local_2a8 = 1;
      pCVar6 = local_268;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffc97,
                          CONCAT16(in_stack_fffffffffffffc96,
                                   CONCAT24(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))));
      std::__cxx11::string::~string(local_248);
      std::ifstream::~ifstream(local_220);
      return pCVar6;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x5ea4b0);
    local_224 = local_224 + 1;
    local_278 = std::__cxx11::string::size();
    local_27c = 0;
    local_280 = 0;
    do {
      if (local_278 <= local_27c) break;
      while( true ) {
        in_stack_fffffffffffffcd8 = (char *)std::__cxx11::string::operator[]((ulong)local_248);
        bVar2 = is_ws(*in_stack_fffffffffffffcd8);
        if (!bVar2 || local_278 <= local_27c) break;
        local_27c = local_27c + 1;
      }
      local_280 = local_27c;
      while( true ) {
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_248);
        bVar2 = not_ws(*pcVar7);
        if (!bVar2 || local_278 <= local_280) break;
        local_280 = local_280 + 1;
      }
      std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_248);
      local_2a4 = Dict::Convert(this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffce0));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_fffffffffffffc80,(value_type_conflict1 *)in_stack_fffffffffffffc78);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_248);
      if (*pcVar7 == ' ') {
        local_27c = local_280 + 1;
        local_2a8 = 4;
      }
      else {
        local_2a8 = 5;
      }
      std::__cxx11::string::~string(local_2a0);
    } while (local_2a8 == 4);
    local_2b0 = local_268;
    local_2b8 = local_260;
    local_2c0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (in_stack_fffffffffffffc78);
    local_2c8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  (in_stack_fffffffffffffc78);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_fffffffffffffc80,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_fffffffffffffc78), bVar2) {
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_2c0);
      local_2cc = *puVar8;
      local_2b0 = Cluster::add_child((Cluster *)CONCAT17(uVar1,in_stack_fffffffffffffce0),
                                     (uint)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_2c0);
    }
    local_2d0 = local_280;
    while( true ) {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_248);
      uVar3 = is_ws(*pcVar7);
      uVar11 = (bool)uVar3 && local_2d0 < local_278;
      if (!(bool)uVar3 || local_2d0 >= local_278) break;
      local_2d0 = local_2d0 + 1;
    }
    local_2d4 = local_2d0;
    while( true ) {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_248);
      in_stack_fffffffffffffc97 = not_ws(*pcVar7);
      word_00 = (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20);
      in_stack_fffffffffffffc96 = (bool)in_stack_fffffffffffffc97 && local_2d4 < local_278;
      if (!(bool)in_stack_fffffffffffffc97 || local_2d4 >= local_278) break;
      local_2d4 = local_2d4 + 1;
    }
    std::__cxx11::string::substr((ulong)local_2f8,(ulong)local_248);
    uVar4 = Dict::Convert(this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffce0));
    in_stack_fffffffffffffc90 = uVar4;
    Cluster::add_word((Cluster *)
                      CONCAT17(in_stack_fffffffffffffc97,
                               CONCAT16(in_stack_fffffffffffffc96,
                                        CONCAT24(in_stack_fffffffffffffc94,uVar4))),word_00);
    sVar9 = std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::size
                      ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)(in_RDI + 8));
    if (sVar9 <= uVar4) {
      std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::resize
                ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)
                 CONCAT17(uVar3,CONCAT16(uVar11,in_stack_fffffffffffffca0)),(size_type)pcVar7);
    }
    in_stack_fffffffffffffc88 = local_2b0;
    ppCVar10 = std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::operator[]
                         ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)(in_RDI + 8),
                          (ulong)uVar4);
    *ppCVar10 = in_stack_fffffffffffffc88;
    std::__cxx11::string::~string(local_2f8);
  } while( true );
}

Assistant:

Cluster* HierarchicalSoftmaxBuilder::ReadClusterFile(const std::string& cluster_file, Dict* word_dict) {
  cerr << "Reading clusters from " << cluster_file << " ...\n";
  ifstream in(cluster_file);
  assert(in);
  int wc = 0;
  string line;
  vector<unsigned> path;
  Cluster* root = new Cluster();
  while(getline(in, line)) {
    path.clear();
    ++wc;
    const unsigned len = line.size();
    unsigned startp = 0;
    unsigned endp = 0;
    while (startp < len) {
      while (is_ws(line[startp]) && startp < len) { ++startp; }
      endp = startp;
      while (not_ws(line[endp]) && endp < len) { ++endp; }
      string symbol = line.substr(startp, endp - startp);
      path.push_back(path_symbols.Convert(symbol));
      if (line[endp] == ' ') {
        startp = endp + 1;
        continue;
      }
      else {
        break;
      }
    }
    Cluster* node = root;
    for (unsigned symbol : path) {
      node = node->add_child(symbol);
    }

    unsigned startw = endp;
    while (is_ws(line[startw]) && startw < len) { ++startw; }
    unsigned endw = startw;
    while (not_ws(line[endw]) && endw < len) { ++endw; }
    assert(endp > startp);
    assert(startw > endp);
    assert(endw > startw);

    string word = line.substr(startw, endw - startw);
    unsigned widx = word_dict->Convert(word);
    node->add_word(widx);

    if (widx2path.size() <= widx) {
      widx2path.resize(widx + 1);
    }
    widx2path[widx] = node;
  }
  cerr << "Done reading clusters.\n";
  return root;
}